

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::UnitTestImpl::CurrentOsStackTraceExceptTop_abi_cxx11_
          (UnitTestImpl *this,int skip_count)

{
  OsStackTraceGetterInterface *pOVar1;
  int in_EDX;
  UnitTestImpl *in_RSI;
  string *in_RDI;
  
  pOVar1 = os_stack_trace_getter(in_RSI);
  (*pOVar1->_vptr_OsStackTraceGetterInterface[2])
            (in_RDI,pOVar1,(ulong)FLAGS_gtest_stack_trace_depth,(ulong)(in_EDX + 1));
  return in_RDI;
}

Assistant:

std::string UnitTestImpl::CurrentOsStackTraceExceptTop(int skip_count) {
  return os_stack_trace_getter()->CurrentStackTrace(
      static_cast<int>(GTEST_FLAG(stack_trace_depth)),
      skip_count + 1
      // Skips the user-specified number of frames plus this function
      // itself.
      );  // NOLINT
}